

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O1

void __thiscall Timidity::Renderer::recompute_amp(Renderer *this,Voice *v)

{
  Sample *pSVar1;
  uint uVar2;
  uint uVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  pSVar1 = v->sample;
  uVar2 = (uint)this->channel[v->channel].volume;
  uVar3 = (uint)this->channel[v->channel].expression;
  if (pSVar1->type == '\0') {
    fVar4 = (float)((uint)(byte)vol_table[v->velocity] *
                   (uint)(byte)vol_table[(ulong)(uVar3 * uVar2) / 0x7f]) * 1.53787e-05;
  }
  else {
    dVar5 = log10(127.0 / (double)v->velocity);
    dVar6 = log10(127.0 / (double)uVar2);
    dVar7 = log10(127.0 / (double)uVar3);
    fVar4 = (float)((dVar7 + dVar6 + dVar5) * 400.0) + pSVar1->initial_attenuation;
  }
  v->attenuation = fVar4;
  return;
}

Assistant:

void Renderer::recompute_amp(Voice *v)
{
	Channel *chan = &channel[v->channel];
	int chanvol = chan->volume;
	int chanexpr = chan->expression;

	if (v->sample->type == INST_GUS)
	{
		v->attenuation = (vol_table[(chanvol * chanexpr) / 127] * vol_table[v->velocity]) * ((127 + 64) / 12419775.f);
	}
	else
	{
		// Implicit modulators from SF2 spec
		double velatten, cc7atten, cc11atten;

		velatten = log10(127.0 / v->velocity);
		cc7atten = log10(127.0 / chanvol);
		cc11atten = log10(127.0 / chanexpr);
		v->attenuation = float(400 * (velatten + cc7atten + cc11atten)) + v->sample->initial_attenuation;
	}
}